

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ap.c
# Opt level: O1

int get_default_directory(AP_CTX *ctx)

{
  bool bVar1;
  char *pcVar2;
  size_t sVar3;
  char *dst;
  int iVar4;
  
  pcVar2 = getenv("HOME");
  if (pcVar2 == (char *)0x0) {
    pcVar2 = "Can not get HOME environment variable\n";
  }
  else {
    if (*pcVar2 != '\0') {
      sVar3 = strlen(pcVar2);
      sVar3 = sVar3 + 7;
      dst = (char *)calloc(1,sVar3);
      ctx->default_dir = dst;
      ap_str_strlcpy(dst,pcVar2,sVar3);
      ap_str_strlcat(ctx->default_dir,"/.ssh",sVar3);
      iVar4 = 0;
      bVar1 = true;
      goto LAB_00103364;
    }
    pcVar2 = "Empty HOME environment variable\n";
  }
  bVar1 = false;
  ap_log(AP_LOG_LEVEL_ERROR,pcVar2);
  iVar4 = 6;
LAB_00103364:
  if ((!bVar1) && (ctx->default_dir != (char *)0x0)) {
    free(ctx->default_dir);
  }
  return iVar4;
}

Assistant:

static int get_default_directory (AP_CTX *ctx)
{
	int			rc					= AP_NO_ERROR;
	const char	*var				= NULL;
	size_t		size;

#	if defined (_WIN32)
	var = getenv ("USERPROFILE"); 
#	else
	var = getenv ("HOME"); 
#	endif
	if (var == NULL)
	{
		ap_error ("Can not get HOME environment variable\n");
		rc = AP_ERROR_ENVIRONMENT;

		goto finish;
	}

	if (*var == '\0')
	{
		ap_error ("Empty HOME environment variable\n");
		rc = AP_ERROR_ENVIRONMENT;

		goto finish;
	}

	size = strlen (var) + sizeof ("/.ssh") + 1;

	ctx->default_dir = calloc (1, size);
	if (rc != AP_NO_ERROR)
	{
		ap_error ("Can not allocate memory for 'dir'\n");
		rc = AP_ERROR_NO_MEMORY;

		goto finish;
	}

	ap_str_strlcpy (ctx->default_dir, var, size);
	ap_str_strlcat (ctx->default_dir, "/.ssh", size);

finish:
	if (rc != AP_NO_ERROR)
	{
		if (ctx->default_dir != NULL)
		{
			free (ctx->default_dir);
		}
	}

	return rc;
}